

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

char * OPENSSL_strdup(char *s)

{
  size_t sVar1;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(s);
    s_local = (char *)OPENSSL_memdup(s,sVar1 + 1);
  }
  return s_local;
}

Assistant:

char *OPENSSL_strdup(const char *s) {
  if (s == NULL) {
    return NULL;
  }
  // Copy the NUL terminator.
  return reinterpret_cast<char *>(OPENSSL_memdup(s, strlen(s) + 1));
}